

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximp.cpp
# Opt level: O0

UChar32 __thiscall icu_63::CaseFoldingUCharIterator::next(CaseFoldingUCharIterator *this)

{
  UChar UVar1;
  int iVar2;
  long lVar3;
  int32_t iVar4;
  uint local_20;
  uint16_t __c2_1;
  uint16_t __c2;
  UChar32 originalC;
  UChar32 foldedC;
  CaseFoldingUCharIterator *this_local;
  
  if (this->fFoldChars == (UChar *)0x0) {
    if (this->fLimit <= this->fIndex) {
      return -1;
    }
    lVar3 = this->fIndex;
    this->fIndex = lVar3 + 1;
    local_20 = (uint)(ushort)this->fChars[lVar3];
    if ((((local_20 & 0xfffffc00) == 0xd800) && (this->fIndex != this->fLimit)) &&
       (UVar1 = this->fChars[this->fIndex], (UVar1 & 0xfc00U) == 0xdc00)) {
      this->fIndex = this->fIndex + 1;
      local_20 = local_20 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
    }
    iVar4 = ucase_toFullFolding_63(local_20,&this->fFoldChars,0);
    this->fFoldLength = iVar4;
    if ((0x1e < this->fFoldLength) || (this->fFoldLength < 0)) {
      if (this->fFoldLength < 0) {
        this->fFoldLength = this->fFoldLength ^ 0xffffffff;
      }
      this->fFoldChars = (UChar *)0x0;
      return this->fFoldLength;
    }
    this->fFoldIndex = 0;
  }
  iVar2 = this->fFoldIndex;
  this->fFoldIndex = iVar2 + 1;
  ___c2_1 = (uint)(ushort)this->fFoldChars[iVar2];
  if ((((___c2_1 & 0xfffffc00) == 0xd800) && (this->fFoldIndex != this->fFoldLength)) &&
     (UVar1 = this->fFoldChars[this->fFoldIndex], (UVar1 & 0xfc00U) == 0xdc00)) {
    this->fFoldIndex = this->fFoldIndex + 1;
    ___c2_1 = ___c2_1 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
  }
  if (this->fFoldLength <= this->fFoldIndex) {
    this->fFoldChars = (UChar *)0x0;
  }
  return ___c2_1;
}

Assistant:

UChar32 CaseFoldingUCharIterator::next() {
    UChar32  foldedC;
    UChar32  originalC;
    if (fFoldChars == NULL) {
        // We are not in a string folding of an earlier character.
        // Start handling the next char from the input UText.
        if (fIndex >= fLimit) {
            return U_SENTINEL;
        }
        U16_NEXT(fChars, fIndex, fLimit, originalC);

        fFoldLength = ucase_toFullFolding(originalC, &fFoldChars, U_FOLD_CASE_DEFAULT);
        if (fFoldLength >= UCASE_MAX_STRING_LENGTH || fFoldLength < 0) {
            // input code point folds to a single code point, possibly itself.
            // See comment in ucase.h for explanation of return values from ucase_toFullFoldings.
            if (fFoldLength < 0) {
                fFoldLength = ~fFoldLength;
            }
            foldedC = (UChar32)fFoldLength;
            fFoldChars = NULL;
            return foldedC;
        }
        // String foldings fall through here.
        fFoldIndex = 0;
    }

    U16_NEXT(fFoldChars, fFoldIndex, fFoldLength, foldedC);
    if (fFoldIndex >= fFoldLength) {
        fFoldChars = NULL;
    }
    return foldedC;
}